

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

int __thiscall CTcSymObjBase::write_refs_to_obj_file(CTcSymObjBase *this,CVmFile *fp)

{
  CTcVocabEntry *pCVar1;
  long seekpos;
  CTcSymbol *pCVar2;
  long seekpos_00;
  CTcVocabEntry **ppCVar3;
  int iVar4;
  uint uVar5;
  CTPNSuperclass *this_00;
  CTPNSuperclassList *pCVar6;
  CTcVocabEntry **ppCVar7;
  
  iVar4 = 0;
  if ((this->field_0xb8 & 0x40) != 0) {
    CVmFile::write_uint4(fp,this->obj_file_idx_);
    seekpos = CVmFile::get_pos(fp);
    uVar5 = 0;
    CVmFile::write_uint2(fp,0);
    if (this->obj_stm_ == (CTPNStmObject *)0x0) {
      this_00 = (CTPNSuperclass *)0x0;
      goto LAB_001dba48;
    }
    pCVar6 = &(this->obj_stm_->super_CTPNStmObjectBase).super_CTPNObjDef.sclist_;
    uVar5 = 0;
    while( true ) {
      this_00 = pCVar6->head_;
LAB_001dba48:
      if (this_00 == (CTPNSuperclass *)0x0) break;
      pCVar2 = CTPNSuperclass::get_sym(this_00);
      if ((pCVar2 != (CTcSymbol *)0x0) &&
         (*(int *)&(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
          == 2)) {
        CVmFile::write_uint4
                  (fp,*(uint *)&pCVar2[4].super_CTcSymbolBase.super_CVmHashEntryCS.
                                super_CVmHashEntry.nxt_);
        uVar5 = uVar5 + 1;
      }
      pCVar6 = (CTPNSuperclassList *)&this_00->nxt_;
    }
    seekpos_00 = CVmFile::get_pos(fp);
    CVmFile::set_pos(fp,seekpos);
    CVmFile::write_uint2(fp,uVar5);
    CVmFile::set_pos(fp,seekpos_00);
    uVar5 = 0;
    ppCVar7 = &this->vocab_;
    for (ppCVar3 = ppCVar7; *ppCVar3 != (CTcVocabEntry *)0x0; ppCVar3 = &(*ppCVar3)->nxt_) {
      uVar5 = uVar5 + 1;
    }
    CVmFile::write_uint2(fp,uVar5);
    iVar4 = 1;
    while (pCVar1 = *ppCVar7, pCVar1 != (CTcVocabEntry *)0x0) {
      CVmFile::write_uint2(fp,(uint)pCVar1->len_);
      CVmFile::write_bytes(fp,pCVar1->txt_,pCVar1->len_);
      CVmFile::write_uint2(fp,(uint)pCVar1->prop_);
      ppCVar7 = &pCVar1->nxt_;
    }
  }
  return iVar4;
}

Assistant:

int CTcSymObjBase::write_refs_to_obj_file(CVmFile *fp)
{
    CTPNSuperclass *sc;
    uint cnt;
    long cnt_pos;
    long end_pos;
    CTcVocabEntry *voc;

    /* 
     *   if this symbol wasn't written to the object file in the first place,
     *   we obviously don't want to include any extra data for it 
     */
    if (!written_to_obj_)
        return FALSE;

    /* write my symbol index */
    fp->write_uint4(get_obj_file_idx());

    /* write a placeholder superclass count */
    cnt_pos = fp->get_pos();
    fp->write_uint2(0);

    /* write my superclass list */
    for (sc = (obj_stm_ != 0 ? obj_stm_->get_first_sc() : 0), cnt = 0 ;
         sc != 0 ; sc = sc->nxt_)
    {
        CTcSymObj *sym;

        /* look up this superclass symbol */
        sym = (CTcSymObj *)sc->get_sym();
        if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
        {
            /* write the superclass symbol index */
            fp->write_uint4(sym->get_obj_file_idx());

            /* count it */
            ++cnt;
        }
    }

    /* go back and write the superclass count */
    end_pos = fp->get_pos();
    fp->set_pos(cnt_pos);
    fp->write_uint2(cnt);
    fp->set_pos(end_pos);

    /* count my vocabulary words */
    for (cnt = 0, voc = vocab_ ; voc != 0 ; ++cnt, voc = voc->nxt_) ;

    /* write my vocabulary words */
    fp->write_uint2(cnt);
    for (voc = vocab_ ; voc != 0 ; voc = voc->nxt_)
    {
        /* write the text of the word */
        fp->write_uint2(voc->len_);
        fp->write_bytes(voc->txt_, voc->len_);

        /* write the property ID */
        fp->write_uint2(voc->prop_);
    }

    /* indicate that we wrote the symbol */
    return TRUE;
}